

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t process_head_file(archive_read *a,rar5 *rar,archive_entry *entry,size_t block_flags)

{
  int64_t *piVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  char cVar7;
  wchar_t wVar8;
  uint8_t *puVar9;
  undefined8 *__ptr;
  undefined8 *puVar10;
  void *__src;
  ulong uVar11;
  char *fmt;
  int error_number;
  uint uVar12;
  size_t __size;
  size_t sVar13;
  long lVar14;
  ulong extra_data_size;
  uint32_t crc;
  uint32_t mtime;
  uint64_t unpacked_size;
  char name_utf8_buf [8192];
  uint32_t local_2058;
  uint32_t local_2054;
  size_t local_2050;
  size_t local_2048;
  uint64_t local_2040;
  uint64_t local_2038 [1025];
  
  local_2054 = 0;
  local_2058 = 0;
  archive_entry_clear(entry);
  if ((undefined1  [19312])((undefined1  [19312])rar->cstate & (undefined1  [19312])0x4) ==
      (undefined1  [19312])0x0) {
    memset(&rar->file,0,0x770);
    blake2sp_init(&(rar->file).b2state,0x20);
    if (((ulong)rar->main & 1) == 0) {
      (rar->cstate).solid_offset = 0;
    }
    else {
      piVar1 = &(rar->cstate).solid_offset;
      *piVar1 = *piVar1 + (rar->cstate).write_ptr;
    }
    (rar->cstate).write_ptr = 0;
    (rar->cstate).last_write_ptr = 0;
    (rar->cstate).last_unstore_ptr = 0;
    (rar->file).redir_type = 0;
    (rar->file).redir_flags = 0;
    free_filters(rar);
  }
  extra_data_size = 0;
  if ((block_flags & 1) != 0) {
    local_2038[0] = 0;
    wVar8 = read_var(a,local_2038,(uint64_t *)0x0);
    extra_data_size = local_2038[0];
    if (wVar8 == L'\0') {
      return L'\x01';
    }
  }
  if ((block_flags & 2) == 0) {
    (rar->file).bytes_remaining = 0;
    fmt = "no data found in file/service block";
  }
  else {
    wVar8 = read_var(a,local_2038,(uint64_t *)0x0);
    if (wVar8 == L'\0') {
      return L'\x01';
    }
    (rar->file).bytes_remaining = local_2038[0];
    wVar8 = read_var(a,local_2038,(uint64_t *)0x0);
    uVar5 = local_2038[0];
    if (wVar8 == L'\0') {
      return L'\x01';
    }
    wVar8 = read_var(a,&local_2040,(uint64_t *)0x0);
    if (wVar8 == L'\0') {
      return L'\x01';
    }
    if ((uVar5 & 8) != 0) {
      fmt = "Files with unknown unpacked size are not supported";
      error_number = 0x16;
      goto LAB_0012d694;
    }
    (rar->file).field_0x20 = (rar->file).field_0x20 & 0xf7 | (char)uVar5 * '\b' & 8U;
    wVar8 = read_var(a,local_2038,(uint64_t *)0x0);
    uVar6 = local_2038[0];
    if (wVar8 == L'\0') {
      return L'\x01';
    }
    if (((uVar5 & 2) != 0) && (cVar7 = read_u32(a,&local_2054), cVar7 == '\0')) {
      return L'\x01';
    }
    if (((uVar5 & 4) != 0) && (cVar7 = read_u32(a,&local_2058), cVar7 == '\0')) {
      return L'\x01';
    }
    wVar8 = read_var(a,local_2038,(uint64_t *)0x0);
    if (wVar8 == L'\0') {
      return L'\x01';
    }
    sVar13 = 0x20000L << ((byte)(local_2038[0] >> 10) & 0xf);
    bVar2 = (rar->file).field_0x20;
    __size = 0;
    if ((bVar2 & 8) == 0) {
      __size = sVar13;
    }
    (rar->cstate).method = (uint)(local_2038[0] >> 7) & 7;
    (rar->cstate).version = ((uint)local_2038[0] & 0x3f) + L'2';
    uVar11 = local_2038[0] >> 6;
    (rar->file).field_0x20 = bVar2 & 0xfe | (byte)uVar11 & 1;
    if ((((uVar11 & 1) == 0) ||
        ((undefined1  [19312])((undefined1  [19312])rar->cstate & (undefined1  [19312])0x10) !=
         (undefined1  [19312])0x0)) || ((rar->cstate).window_buf != (uint8_t *)0x0)) {
      if (__size < 0x4000001) {
        if ((uVar11 & 1) == 0) {
          *(byte *)&rar->cstate = *(byte *)&rar->cstate & 0xef;
        }
        else {
          sVar4 = (rar->file).solid_window_size;
          if ((0 < (long)sVar4) && (sVar4 != __size)) {
            fmt = 
            "Window size for this solid file doesn\'t match the window size used in previous solid file. "
            ;
            goto LAB_0012d68c;
          }
        }
        local_2050 = sVar13;
        if (((rar->cstate).window_size < (long)__size) &&
           (puVar9 = (rar->cstate).window_buf, puVar9 != (uint8_t *)0x0)) {
          (rar->cstate).dready[1].size = 0;
          (rar->cstate).dready[1].offset = 0;
          *(undefined8 *)((rar->cstate).dready + 1) = 0;
          (rar->cstate).dready[1].buf = (uint8_t *)0x0;
          (rar->cstate).dready[0].size = 0;
          (rar->cstate).dready[0].offset = 0;
          *(undefined8 *)(rar->cstate).dready = 0;
          (rar->cstate).dready[0].buf = (uint8_t *)0x0;
          local_2048 = __size;
          puVar9 = (uint8_t *)realloc(puVar9,__size);
          if (puVar9 == (uint8_t *)0x0) {
            archive_set_error(&a->archive,0x16,
                              "Not enough memory when trying to realloc the window buffer.");
            return L'\xffffffe2';
          }
          (rar->cstate).window_buf = puVar9;
          __size = local_2048;
        }
        (rar->cstate).window_size = __size;
        bVar3 = (rar->file).field_0x20;
        if (((bVar3 & 1) != 0) && ((rar->file).solid_window_size == 0)) {
          (rar->file).solid_window_size = __size;
        }
        lVar14 = local_2050 - 1;
        local_2050 = 0;
        if ((bVar2 & 8) != 0) {
          lVar14 = 0;
        }
        (rar->cstate).window_mask = lVar14;
        (rar->file).field_0x20 = bVar3 & 0xfd;
        wVar8 = read_var(a,local_2038,(uint64_t *)0x0);
        if (wVar8 == L'\0') {
          return L'\x01';
        }
        local_2050 = local_2038[0];
        if (local_2038[0] == 1) {
          archive_entry_set_mode(entry,(mode_t)uVar6);
        }
        else {
          if (local_2038[0] != 0) {
            archive_set_error(&a->archive,0x54,"Unsupported Host OS: 0x%jx");
            return L'\xffffffe2';
          }
          uVar12 = 0x416d;
          if ((uVar6 & 0x10) == 0) {
            uVar12 = 0x8124;
          }
          archive_entry_set_mode(entry,uVar12 | (uint)((uVar6 & 1) == 0) << 7);
          if (((uVar6 & 7) != 0) && (__ptr = (undefined8 *)malloc(0x16), __ptr != (undefined8 *)0x0)
             ) {
            puVar10 = __ptr;
            if ((uVar6 & 1) != 0) {
              *__ptr = 0x796c6e6f64722c;
              puVar10 = (undefined8 *)((long)__ptr + 7);
            }
            if ((uVar6 & 2) != 0) {
              *puVar10 = 0x6e65646469682c;
              puVar10 = (undefined8 *)((long)puVar10 + 7);
            }
            if ((uVar6 & 4) != 0) {
              *puVar10 = 0x6d65747379732c;
              puVar10 = (undefined8 *)((long)puVar10 + 7);
            }
            if (__ptr < puVar10) {
              archive_entry_copy_fflags_text(entry,(char *)((long)__ptr + 1));
            }
            free(__ptr);
          }
        }
        wVar8 = read_var(a,local_2038,(uint64_t *)0x0);
        uVar6 = local_2038[0];
        if (wVar8 == L'\0') {
          return L'\x01';
        }
        if (local_2038[0] < 0x800) {
          if (local_2038[0] != 0) {
            local_2038[0] = 0xffffffffffffffff;
            __src = __archive_read_ahead(a,uVar6,(ssize_t *)local_2038);
            if (__src == (void *)0x0) {
              return L'\x01';
            }
            memcpy(local_2038,__src,uVar6);
            *(undefined1 *)((long)local_2038 + uVar6) = 0;
            uVar11 = __archive_read_consume(a,uVar6);
            if (uVar11 != uVar6) {
              return L'\x01';
            }
            archive_entry_update_pathname_utf8(entry,(char *)local_2038);
            if ((0 < (long)extra_data_size) &&
               (wVar8 = process_head_file_extra(a,entry,rar,extra_data_size), wVar8 != L'\0')) {
              return wVar8;
            }
            (rar->file).unpacked_size = local_2040;
            if ((rar->file).redir_type == 0) {
              archive_entry_set_size(entry,local_2040);
            }
            if ((uVar5 & 2) != 0) {
              archive_entry_set_mtime(entry,(ulong)local_2054,0);
            }
            if ((uVar5 & 4) != 0) {
              (rar->file).stored_crc32 = local_2058;
            }
            if ((*(byte *)&rar->cstate & 4) == 0) {
              *(byte *)&rar->cstate = *(byte *)&rar->cstate & 0xf0 | 10;
            }
            if ((undefined1  [12])((undefined1  [12])rar->generic & (undefined1  [12])0x2) !=
                (undefined1  [12])0x0) {
              return L'\xfffffff6';
            }
            return L'\0';
          }
          fmt = "No filename specified";
        }
        else {
          fmt = "Filename is too long";
        }
      }
      else {
        fmt = "Declared dictionary size is not supported.";
      }
    }
    else {
      fmt = "Declared solid file, but no window buffer initialized yet.";
    }
  }
LAB_0012d68c:
  error_number = 0x54;
LAB_0012d694:
  archive_set_error(&a->archive,error_number,fmt);
  return L'\xffffffe2';
}

Assistant:

static int process_head_file(struct archive_read* a, struct rar5* rar,
    struct archive_entry* entry, size_t block_flags)
{
	int64_t extra_data_size = 0;
	size_t data_size = 0;
	size_t file_flags = 0;
	size_t file_attr = 0;
	size_t compression_info = 0;
	size_t host_os = 0;
	size_t name_size = 0;
	uint64_t unpacked_size, window_size;
	uint32_t mtime = 0, crc = 0;
	int c_method = 0, c_version = 0;
	char name_utf8_buf[MAX_NAME_IN_BYTES];
	const uint8_t* p;

	enum FILE_FLAGS {
		DIRECTORY = 0x0001, UTIME = 0x0002, CRC32 = 0x0004,
		UNKNOWN_UNPACKED_SIZE = 0x0008,
	};

	enum FILE_ATTRS {
		ATTR_READONLY = 0x1, ATTR_HIDDEN = 0x2, ATTR_SYSTEM = 0x4,
		ATTR_DIRECTORY = 0x10,
	};

	enum COMP_INFO_FLAGS {
		SOLID = 0x0040,
	};

	enum HOST_OS {
		HOST_WINDOWS = 0,
		HOST_UNIX = 1,
	};

	archive_entry_clear(entry);

	/* Do not reset file context if we're switching archives. */
	if(!rar->cstate.switch_multivolume) {
		reset_file_context(rar);
	}

	if(block_flags & HFL_EXTRA_DATA) {
		uint64_t edata_size = 0;
		if(!read_var(a, &edata_size, NULL))
			return ARCHIVE_EOF;

		/* Intentional type cast from unsigned to signed. */
		extra_data_size = (int64_t) edata_size;
	}

	if(block_flags & HFL_DATA) {
		if(!read_var_sized(a, &data_size, NULL))
			return ARCHIVE_EOF;

		rar->file.bytes_remaining = data_size;
	} else {
		rar->file.bytes_remaining = 0;

		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"no data found in file/service block");
		return ARCHIVE_FATAL;
	}

	if(!read_var_sized(a, &file_flags, NULL))
		return ARCHIVE_EOF;

	if(!read_var(a, &unpacked_size, NULL))
		return ARCHIVE_EOF;

	if(file_flags & UNKNOWN_UNPACKED_SIZE) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Files with unknown unpacked size are not supported");
		return ARCHIVE_FATAL;
	}

	rar->file.dir = (uint8_t) ((file_flags & DIRECTORY) > 0);

	if(!read_var_sized(a, &file_attr, NULL))
		return ARCHIVE_EOF;

	if(file_flags & UTIME) {
		if(!read_u32(a, &mtime))
			return ARCHIVE_EOF;
	}

	if(file_flags & CRC32) {
		if(!read_u32(a, &crc))
			return ARCHIVE_EOF;
	}

	if(!read_var_sized(a, &compression_info, NULL))
		return ARCHIVE_EOF;

	c_method = (int) (compression_info >> 7) & 0x7;
	c_version = (int) (compression_info & 0x3f);

	/* RAR5 seems to limit the dictionary size to 64MB. */
	window_size = (rar->file.dir > 0) ?
		0 :
		g_unpack_window_size << ((compression_info >> 10) & 15);
	rar->cstate.method = c_method;
	rar->cstate.version = c_version + 50;
	rar->file.solid = (compression_info & SOLID) > 0;

	/* Archives which declare solid files without initializing the window
	 * buffer first are invalid, unless previous data was encrypted, in
	 * which case we may never have had the chance */

	if(rar->file.solid > 0 && rar->cstate.data_encrypted == 0 &&
	    rar->cstate.window_buf == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "Declared solid file, but no window buffer "
				  "initialized yet.");
		return ARCHIVE_FATAL;
	}

	/* Check if window_size is a sane value. Also, if the file is not
	 * declared as a directory, disallow window_size == 0. */
	if(window_size > (64 * 1024 * 1024) ||
	    (rar->file.dir == 0 && window_size == 0))
	{
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Declared dictionary size is not supported.");
		return ARCHIVE_FATAL;
	}

	if(rar->file.solid > 0) {
		/* Re-check if current window size is the same as previous
		 * window size (for solid files only). */
		if(rar->file.solid_window_size > 0 &&
		    rar->file.solid_window_size != (ssize_t) window_size)
		{
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Window size for this solid file doesn't match "
			    "the window size used in previous solid file. ");
			return ARCHIVE_FATAL;
		}
	}
	else
		rar->cstate.data_encrypted = 0; /* Reset for new buffer */

	if(rar->cstate.window_size < (ssize_t) window_size &&
	    rar->cstate.window_buf)
	{
		/* The `data_ready` stack contains pointers to the `window_buf` or
		 * `filtered_buf` buffers.  Since we're about to reallocate the first
		 * buffer, some of those pointers could become invalid. Therefore, we
		 * need to dispose of all entries from the stack before attempting the
		 * realloc. */
		clear_data_ready_stack(rar);

		/* If window_buf has been allocated before, reallocate it, so
		 * that its size will match new window_size. */

		uint8_t* new_window_buf =
			realloc(rar->cstate.window_buf, (size_t) window_size);

		if(!new_window_buf) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
				"Not enough memory when trying to realloc the window "
				"buffer.");
			return ARCHIVE_FATAL;
		}

		rar->cstate.window_buf = new_window_buf;
	}

	/* Values up to 64M should fit into ssize_t on every
	 * architecture. */
	rar->cstate.window_size = (ssize_t) window_size;

	if(rar->file.solid > 0 && rar->file.solid_window_size == 0) {
		/* Solid files have to have the same window_size across
		   whole archive. Remember the window_size parameter
		   for first solid file found. */
		rar->file.solid_window_size = rar->cstate.window_size;
	}

	init_window_mask(rar);

	rar->file.service = 0;

	if(!read_var_sized(a, &host_os, NULL))
		return ARCHIVE_EOF;

	if(host_os == HOST_WINDOWS) {
		/* Host OS is Windows */

		__LA_MODE_T mode;

		if(file_attr & ATTR_DIRECTORY) {
			if (file_attr & ATTR_READONLY) {
				mode = 0555 | AE_IFDIR;
			} else {
				mode = 0755 | AE_IFDIR;
			}
		} else {
			if (file_attr & ATTR_READONLY) {
				mode = 0444 | AE_IFREG;
			} else {
				mode = 0644 | AE_IFREG;
			}
		}

		archive_entry_set_mode(entry, mode);

		if (file_attr & (ATTR_READONLY | ATTR_HIDDEN | ATTR_SYSTEM)) {
			char *fflags_text, *ptr;
			/* allocate for ",rdonly,hidden,system" */
			fflags_text = malloc(22 * sizeof(*fflags_text));
			if (fflags_text != NULL) {
				ptr = fflags_text;
				if (file_attr & ATTR_READONLY) {
					strcpy(ptr, ",rdonly");
					ptr = ptr + 7;
				}
				if (file_attr & ATTR_HIDDEN) {
					strcpy(ptr, ",hidden");
					ptr = ptr + 7;
				}
				if (file_attr & ATTR_SYSTEM) {
					strcpy(ptr, ",system");
					ptr = ptr + 7;
				}
				if (ptr > fflags_text) {
					archive_entry_copy_fflags_text(entry,
					    fflags_text + 1);
				}
				free(fflags_text);
			}
		}
	} else if(host_os == HOST_UNIX) {
		/* Host OS is Unix */
		archive_entry_set_mode(entry, (__LA_MODE_T) file_attr);
	} else {
		/* Unknown host OS */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"Unsupported Host OS: 0x%jx",
				(uintmax_t)host_os);

		return ARCHIVE_FATAL;
	}

	if(!read_var_sized(a, &name_size, NULL))
		return ARCHIVE_EOF;

	if(name_size > (MAX_NAME_IN_CHARS - 1)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"Filename is too long");

		return ARCHIVE_FATAL;
	}

	if(name_size == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"No filename specified");

		return ARCHIVE_FATAL;
	}

	if(!read_ahead(a, name_size, &p))
		return ARCHIVE_EOF;

	memcpy(name_utf8_buf, p, name_size);
	name_utf8_buf[name_size] = 0;
	if(ARCHIVE_OK != consume(a, name_size)) {
		return ARCHIVE_EOF;
	}

	archive_entry_update_pathname_utf8(entry, name_utf8_buf);

	if(extra_data_size > 0) {
		int ret = process_head_file_extra(a, entry, rar,
		    extra_data_size);

		/*
		 * TODO: rewrite or remove useless sanity check
		 *       as extra_data_size is not passed as a pointer
		 *
		if(extra_data_size < 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			    "File extra data size is not zero");
			return ARCHIVE_FATAL;
		}
		 */

		if(ret != ARCHIVE_OK)
			return ret;
	}

	if((file_flags & UNKNOWN_UNPACKED_SIZE) == 0) {
		rar->file.unpacked_size = (ssize_t) unpacked_size;
		if(rar->file.redir_type == REDIR_TYPE_NONE)
			archive_entry_set_size(entry, unpacked_size);
	}

	if(file_flags & UTIME) {
		archive_entry_set_mtime(entry, (time_t) mtime, 0);
	}

	if(file_flags & CRC32) {
		rar->file.stored_crc32 = crc;
	}

	if(!rar->cstate.switch_multivolume) {
		/* Do not reinitialize unpacking state if we're switching
		 * archives. */
		rar->cstate.block_parsing_finished = 1;
		rar->cstate.all_filters_applied = 1;
		rar->cstate.initialized = 0;
	}

	if(rar->generic.split_before > 0) {
		/* If now we're standing on a header that has a 'split before'
		 * mark, it means we're standing on a 'continuation' file
		 * header. Signal the caller that if it wants to move to
		 * another file, it must call rar5_read_header() function
		 * again. */

		return ARCHIVE_RETRY;
	} else {
		return ARCHIVE_OK;
	}
}